

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution_x86_fma::forward
          (Deconvolution_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int i;
  int i_00;
  uint i_01;
  pointer pMVar1;
  int *piVar2;
  long *plVar3;
  Option *pOVar4;
  Deconvolution_x86_fma *pDVar5;
  Allocator *pAVar6;
  Layer *pLVar7;
  void *pvVar8;
  ulong uVar9;
  int j;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  Allocator *pAVar17;
  int k;
  ulong uVar18;
  uint uVar19;
  void *pvVar20;
  ParamDict pd;
  Mat local_1d8;
  Mat local_188;
  Option *local_140;
  pointer local_138;
  Deconvolution_x86_fma *local_130;
  ModelBinFromMatArray local_128;
  Mat local_118;
  Mat local_c8;
  void *local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined8 local_70;
  int local_68;
  Allocator *local_60;
  int iStack_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  size_t local_40;
  
  pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_138 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  uVar19 = pMVar1->elempack * pMVar1->c;
  i = pMVar1[1].w;
  i_00 = pMVar1[1].h;
  i_01 = pMVar1[1].d;
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize._0_4_ = 0;
  local_118.elemsize._4_4_ = 0;
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  local_130 = this;
  flatten(pMVar1 + 1,&local_118,opt);
  iVar10 = -100;
  local_1d8.elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
  local_118.elemsize = CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
  local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70);
  if ((local_118.data == (void *)0x0) ||
     (local_1d8.elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize),
     local_118.elemsize = CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize),
     local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70),
     (long)local_118.c * local_118.cstep == 0)) goto LAB_0027748e;
  local_118.w = local_118.w * local_118.elempack;
  local_118.elemsize =
       CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize) /
       (ulong)(long)local_118.elempack;
  local_188.cstep = 0;
  local_118.elempack = 1;
  uVar16 = i_00 * i;
  local_188.data = (Allocator *)0x0;
  local_188.refcount._0_4_ = 0;
  local_188.refcount._4_4_ = 0;
  local_188.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_188.elempack = 0;
  local_188.allocator = (Allocator *)local_188.data;
  local_188.dims = (int)local_188.refcount;
  local_188.w = local_188.refcount._4_4_;
  local_188._48_8_ = local_188.elemsize;
  local_188.c = local_188.elempack;
  local_140 = opt;
  Mat::create(&local_188,i_01 * uVar19 * uVar16,4,opt->workspace_allocator);
  pDVar5 = local_130;
  pOVar4 = local_140;
  iVar10 = -100;
  local_1d8.elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
  local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70);
  if (((Allocator *)local_188.data != (Allocator *)0x0) &&
     (local_1d8.elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize),
     local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70),
     (long)local_188.c * local_188.cstep != 0)) {
    uVar9 = 0;
    uVar12 = 0;
    if (0 < (int)uVar16) {
      uVar12 = (ulong)uVar16;
    }
    uVar13 = 0;
    if (0 < (int)uVar19) {
      uVar13 = (ulong)uVar19;
    }
    lVar14 = (long)(int)uVar16;
    uVar15 = 0;
    if (0 < (int)i_01) {
      uVar15 = (ulong)i_01;
    }
    pAVar6 = (Allocator *)local_188.data;
    pvVar8 = local_118.data;
    for (; uVar9 != uVar15; uVar9 = uVar9 + 1) {
      pAVar17 = pAVar6;
      pvVar20 = pvVar8;
      for (uVar11 = 0; uVar11 != uVar13; uVar11 = uVar11 + 1) {
        for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
          *(undefined4 *)((long)&pAVar17->_vptr_Allocator + uVar18 * 4) =
               *(undefined4 *)((long)pvVar20 + uVar18 * 4);
        }
        pAVar17 = (Allocator *)((long)&pAVar17->_vptr_Allocator + lVar14 * 4);
        pvVar20 = (void *)((long)pvVar20 + (int)i_01 * lVar14 * 4);
      }
      pAVar6 = (Allocator *)((long)&pAVar6->_vptr_Allocator + (int)uVar19 * lVar14 * 4);
      pvVar8 = (void *)((long)pvVar8 + lVar14 * 4);
    }
    local_1d8.cstep = 0;
    local_1d8.data = (void *)0x0;
    local_1d8.refcount._0_4_ = 0;
    local_1d8.refcount._4_4_ = 0;
    local_1d8.elemsize._0_4_ = 0;
    local_1d8.elemsize._4_4_ = 0;
    local_1d8.elemsize = 0;
    local_1d8.elempack = 0;
    local_1d8.allocator = (Allocator *)0x0;
    local_1d8.dims = 0;
    local_1d8.w = 0;
    local_1d8.h = 0;
    local_1d8.d = 0;
    local_1d8.c = 0;
    if ((local_130->super_Deconvolution).bias_term == 0) {
LAB_00277034:
      pLVar7 = create_layer_cpu(8);
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,i_01);
      ParamDict::set(&pd,1,i);
      ParamDict::set(&pd,0xb,i_00);
      ParamDict::set(&pd,2,(pDVar5->super_Deconvolution).dilation_w);
      ParamDict::set(&pd,0xc,(pDVar5->super_Deconvolution).dilation_h);
      ParamDict::set(&pd,3,(pDVar5->super_Deconvolution).stride_w);
      ParamDict::set(&pd,0xd,(pDVar5->super_Deconvolution).stride_h);
      ParamDict::set(&pd,4,(pDVar5->super_Deconvolution).pad_left);
      ParamDict::set(&pd,0xf,(pDVar5->super_Deconvolution).pad_right);
      ParamDict::set(&pd,0xe,(pDVar5->super_Deconvolution).pad_top);
      ParamDict::set(&pd,0x10,(pDVar5->super_Deconvolution).pad_bottom);
      ParamDict::set(&pd,0x12,(pDVar5->super_Deconvolution).output_pad_right);
      ParamDict::set(&pd,0x13,(pDVar5->super_Deconvolution).output_pad_bottom);
      ParamDict::set(&pd,0x14,(pDVar5->super_Deconvolution).output_w);
      ParamDict::set(&pd,0x15,(pDVar5->super_Deconvolution).output_h);
      ParamDict::set(&pd,5,(pDVar5->super_Deconvolution).bias_term);
      ParamDict::set(&pd,6,local_188.w);
      ParamDict::set(&pd,9,(pDVar5->super_Deconvolution).activation_type);
      ParamDict::set(&pd,10,&(pDVar5->super_Deconvolution).activation_params);
      (*pLVar7->_vptr_Layer[2])(pLVar7,&pd);
      piVar2 = (int *)CONCAT44(local_188.refcount._4_4_,(int)local_188.refcount);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      local_c8.elemsize._0_4_ = (undefined4)local_188.elemsize;
      local_c8.elemsize._4_4_ = (undefined4)(local_188.elemsize >> 0x20);
      local_c8.h = local_188.h;
      local_c8.d = local_188.d;
      piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      local_c8.cstep = local_188.cstep;
      local_c8.c = local_188.c;
      local_c8.w = local_188.w;
      local_c8.dims = local_188.dims;
      local_c8.allocator = local_188.allocator;
      local_c8.elempack = local_188.elempack;
      local_c8.refcount._4_4_ = local_188.refcount._4_4_;
      local_c8.refcount._0_4_ = (int)local_188.refcount;
      local_c8.data = local_188.data;
      local_70 = local_1d8.elemsize;
      local_80 = local_1d8.data;
      uStack_78 = local_1d8.refcount._0_4_;
      uStack_74 = local_1d8.refcount._4_4_;
      local_68 = local_1d8.elempack;
      local_60 = local_1d8.allocator;
      iStack_58 = local_1d8.dims;
      iStack_54 = local_1d8.w;
      iStack_50 = local_1d8.h;
      iStack_4c = local_1d8.d;
      local_48 = local_1d8.c;
      local_40 = local_1d8.cstep;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_128,&local_c8);
      (*pLVar7->_vptr_Layer[3])(pLVar7,&local_128);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_128);
      (*pLVar7->_vptr_Layer[4])(pLVar7,pOVar4);
      (*pLVar7->_vptr_Layer[7])(pLVar7,pMVar1,local_138,pOVar4);
      (*pLVar7->_vptr_Layer[5])(pLVar7,pOVar4);
      (*pLVar7->_vptr_Layer[1])(pLVar7);
      lVar14 = 0x48;
      do {
        piVar2 = *(int **)((long)&local_c8.refcount + lVar14);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            plVar3 = *(long **)((long)&local_c8.allocator + lVar14);
            if (plVar3 == (long *)0x0) {
              free(*(void **)((long)&local_c8.data + lVar14));
            }
            else {
              (**(code **)(*plVar3 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_c8.cstep + lVar14) = 0;
        *(undefined8 *)((long)&local_c8.refcount + lVar14 + 4) = 0;
        *(undefined8 *)((long)&local_c8.elemsize + lVar14 + 4) = 0;
        *(undefined8 *)((long)&local_c8.data + lVar14) = 0;
        *(undefined8 *)((long)&local_c8.refcount + lVar14) = 0;
        *(undefined4 *)((long)&local_c8.c + lVar14) = 0;
        *(undefined8 *)((long)&local_c8.dims + lVar14) = 0;
        *(undefined8 *)((long)&local_c8.h + lVar14) = 0;
        lVar14 = lVar14 + -0x48;
      } while (lVar14 != -0x48);
      ParamDict::~ParamDict(&pd);
      iVar10 = 0;
    }
    else {
      flatten((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + 2,&local_1d8,local_140);
      iVar10 = -100;
      local_1d8.elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
      local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70);
      if ((local_1d8.data != (void *)0x0) &&
         (local_1d8.elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize),
         local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70),
         (long)local_1d8.c * local_1d8.cstep != 0)) {
        local_1d8.w = local_1d8.w * local_1d8.elempack;
        local_1d8.elemsize =
             CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize) /
             (ulong)(long)local_1d8.elempack;
        local_1d8.elempack = 1;
        goto LAB_00277034;
      }
    }
    piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_1d8.allocator == (Allocator *)0x0) {
          free(local_1d8.data);
        }
        else {
          (*(local_1d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar2 = (int *)CONCAT44(local_188.refcount._4_4_,(int)local_188.refcount);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_188.allocator == (Allocator *)0x0) {
        free(local_188.data);
      }
      else {
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0027748e:
  piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        free(local_118.data);
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar10;
}

Assistant:

int Deconvolution_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.c * bottom_blob.elempack;
    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.d * 1;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // weight_data_flattened as pack1
    weight_data_flattened.w *= weight_data_flattened.elempack;
    weight_data_flattened.elemsize /= weight_data_flattened.elempack;
    weight_data_flattened.elempack = 1;

    // transpose group-inch/group-outch/group-kh-kw to group-outch/group-inch/group-kh-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _kernel_h * _num_output * _num_input / 1, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / 1;
        const int inch_g = _num_input / 1;
        const int maxk = _kernel_h * _kernel_w;

        for (int g = 0; g < 1; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;

        // bias_data_flattened as pack1
        bias_data_flattened.w *= bias_data_flattened.elempack;
        bias_data_flattened.elemsize /= bias_data_flattened.elempack;
        bias_data_flattened.elempack = 1;
    }

    ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::Deconvolution);

    ncnn::ParamDict pd;
    pd.set(0, _num_output);
    pd.set(1, _kernel_w);
    pd.set(11, _kernel_h);
    pd.set(2, dilation_w);
    pd.set(12, dilation_h);
    pd.set(3, stride_w);
    pd.set(13, stride_h);
    pd.set(4, pad_left);
    pd.set(15, pad_right);
    pd.set(14, pad_top);
    pd.set(16, pad_bottom);
    pd.set(18, output_pad_right);
    pd.set(19, output_pad_bottom);
    pd.set(20, output_w);
    pd.set(21, output_h);
    pd.set(5, bias_term);
    pd.set(6, weight_data_transposed.w);
    pd.set(9, activation_type);
    pd.set(10, activation_params);

    op->load_param(pd);

    ncnn::Mat weights[2];
    weights[0] = weight_data_transposed;
    weights[1] = bias_data_flattened;

    op->load_model(ncnn::ModelBinFromMatArray(weights));

    op->create_pipeline(opt);

    op->forward(bottom_blob, top_blob, opt);

    op->destroy_pipeline(opt);

    delete op;

    return 0;
}